

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene.cxx
# Opt level: O2

bool __thiscall xray_re::xr_scene::load(xr_scene *this,char *name)

{
  uint32_t *puVar1;
  pointer ppxVar2;
  xr_scene_part *pxVar3;
  bool bVar4;
  xr_reader *this_00;
  size_t sVar5;
  xr_reader *this_01;
  pointer ppxVar6;
  uint32_t version;
  xr_file_system *local_90;
  xr_reader *s;
  string parts_path;
  xr_reader *s_1;
  xr_guid guid;
  
  local_90 = xr_file_system::instance();
  std::__cxx11::string::string<std::allocator<char>>((string *)&guid,name,(allocator<char> *)&s);
  std::operator+(&parts_path,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&guid,".level"
                );
  this_00 = xr_file_system::r_open(local_90,"$maps$",parts_path._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&parts_path);
  std::__cxx11::string::~string((string *)&guid);
  if (this_00 != (xr_reader *)0x0) {
    sVar5 = xr_reader::r_chunk<unsigned_int>(this_00,0x9df3,&version);
    if (sVar5 == 0) {
      msg("no scene version chunk");
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene.cxx"
                    ,0x118,"bool xray_re::xr_scene::load(const char *)");
    }
    if (version != 5) {
      __assert_fail("version == SCENE_VERSION",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene.cxx"
                    ,0x11a,"bool xray_re::xr_scene::load(const char *)");
    }
    s = xr_reader::open_chunk(this_00,0x7711);
    if (s == (xr_reader *)0x0) {
      msg("no level options chunk");
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene.cxx"
                    ,0x126,"bool xray_re::xr_scene::load(const char *)");
    }
    load_options(this,s);
    xr_reader::close_chunk(this_00,&s);
    sVar5 = xr_reader::find_chunk(this_00,0x7709);
    if (sVar5 == 0) {
      msg("no scene camera chunk");
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene.cxx"
                    ,0x12f,"bool xray_re::xr_scene::load(const char *)");
    }
    xr_reader::r_fvector3(this_00,&this->m_camera_pos);
    xr_reader::r_fvector3(this_00,&this->m_camera_orient);
    sVar5 = xr_reader::r_chunk<xray_re::xr_guid>(this_00,0x7000,&this->m_guid);
    if (sVar5 == 0) {
      msg("no tools GUID chunk");
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene.cxx"
                    ,0x134,"bool xray_re::xr_scene::load(const char *)");
    }
    xr_scene_revision::load(&this->m_revision,this_00);
    sVar5 = xr_reader::find_chunk(this_00,0x7712);
    if (sVar5 != 0) {
      (this_00->field_2).m_p = (this_00->field_2).m_p + 4;
    }
    load_objects(this,this_00,0x7708,&this->m_objects);
    sVar5 = xr_reader::find_chunk(this_00,0x7710);
    if (sVar5 != 0) {
      puVar1 = (this_00->field_2).m_p_u32;
      (this_00->field_2).m_p = (uint8_t *)(puVar1 + 1);
      xr_reader::
      r_seq<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,xray_re::xr_reader::f_r_sz>
                (this_00,*puVar1,&this->m_snap_objects);
    }
    (*this_00->_vptr_xr_reader[1])(this_00);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&parts_path,name,(allocator<char> *)&guid);
    std::__cxx11::string::push_back((char)&parts_path);
    ppxVar2 = (this->m_parts).
              super__Vector_base<xray_re::xr_scene_part_*,_std::allocator<xray_re::xr_scene_part_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppxVar6 = (this->m_parts).
                   super__Vector_base<xray_re::xr_scene_part_*,_std::allocator<xray_re::xr_scene_part_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppxVar6 != ppxVar2;
        ppxVar6 = ppxVar6 + 1) {
      pxVar3 = *ppxVar6;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&guid,
                     &parts_path,pxVar3->m_file_name);
      this_01 = xr_file_system::r_open(local_90,"$maps$",(char *)guid.g._0_8_);
      std::__cxx11::string::~string((string *)&guid);
      if (this_01 == (xr_reader *)0x0) {
        msg("can\'t load scene part %s",pxVar3->m_file_name);
        __assert_fail("r",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene.cxx"
                      ,0x14f,"bool xray_re::xr_scene::load(const char *)");
      }
      sVar5 = xr_reader::r_chunk<xray_re::xr_guid>(this_01,0x7000,&guid);
      if (sVar5 == 0) {
LAB_001759a4:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene.cxx"
                      ,0x152,"bool xray_re::xr_scene::load(const char *)");
      }
      bVar4 = xr_guid::operator!=(&guid,&this->m_guid);
      if (bVar4) goto LAB_001759a4;
      s_1 = xr_reader::open_chunk(this_01,pxVar3->m_chunk_id);
      if (s_1 == (xr_reader *)0x0) {
        __assert_fail("s",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene.cxx"
                      ,0x155,"bool xray_re::xr_scene::load(const char *)");
      }
      (*pxVar3->_vptr_xr_scene_part[2])(pxVar3,s_1);
      xr_reader::close_chunk(this_01,&s_1);
      (*this_01->_vptr_xr_reader[1])(this_01);
    }
    std::__cxx11::string::~string((string *)&parts_path);
  }
  return this_00 != (xr_reader *)0x0;
}

Assistant:

bool xr_scene::load(const char* name)
{
	xr_file_system& fs = xr_file_system::instance();
	xr_reader* r = fs.r_open(PA_MAPS, std::string(name) + ".level");
	if (r == 0)
		return false;

	uint32_t version;
	if (!r->r_chunk<uint32_t>(SCENE_CHUNK_VERSION, version)) {
		msg("no scene version chunk");
		xr_not_expected();
	}
	xr_assert(version == SCENE_VERSION);
	if (version != SCENE_VERSION) {
		msg("unexpected scene version %" PRIu32, version);
		xr_not_expected();
	}

	xr_reader* s = r->open_chunk(SCENE_CHUNK_OPTIONS);
	if (s) {
		load_options(*s);
		r->close_chunk(s);
	} else {
		msg("no level options chunk");
		xr_not_expected();
	}

	if (r->find_chunk(SCENE_CHUNK_CAMERA)) {
		r->r_fvector3(m_camera_pos);
		r->r_fvector3(m_camera_orient);
		r->debug_find_chunk();
	} else {
		msg("no scene camera chunk");
		xr_not_expected();
	}

	if (!r->r_chunk<xr_guid>(TOOLS_CHUNK_GUID, m_guid)) {
		msg("no tools GUID chunk");
		xr_not_expected();
	}

	m_revision.load(*r);

	size_t num_objects = 0;
	if (r->find_chunk(SCENE_CHUNK_COUNT)) {
		num_objects = r->r_u32();
		r->debug_find_chunk();
	}

	load_objects(*r, SCENE_CHUNK_OBJECTS, m_objects);

	if (r->find_chunk(SCENE_CHUNK_SNAP_OBJECTS))
		r->r_seq(r->r_u32(), m_snap_objects, xr_reader::f_r_sz());

	fs.r_close(r);

	std::string parts_path(name);
	parts_path += '\\';
	for (xr_scene_part_vec_it it = m_parts.begin(), end = m_parts.end();
			it != end; ++it) {
		xr_scene_part* part = *it;

		r = fs.r_open(PA_MAPS, parts_path + part->file_name());
		if (r == 0)
			msg("can't load scene part %s", part->file_name());
		xr_assert(r);
		xr_guid guid;
		if (!r->r_chunk<xr_guid>(TOOLS_CHUNK_GUID, guid) || guid != m_guid)
			xr_not_expected();

		xr_reader* s = r->open_chunk(part->chunk_id());
		xr_assert(s);
		if (s) {
			part->load(*s);
			r->close_chunk(s);
		}
		fs.r_close(r);
	}

	return true;
}